

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O2

void injection::InjectionManager::bind_singleton<ITest>(ITest *singleton)

{
  ITest *singleton_local;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &singleton_local;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<ITest_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/reyesr[P]injection/include/injectionmanager.h:130:35)>
             ::_M_manager;
  singleton_local = singleton;
  bind<ITest>((function<ITest_*()> *)&local_28,SINGLETON_EAGER);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

static void bind_singleton(I* singleton) {
        InjectionManager::bind<I>([&singleton](){return singleton;}, InjectionScope::SINGLETON_EAGER);
    }